

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deepidselect.cpp
# Opt level: O0

void setIds(IDManifest *mfst,
           list<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
           *ids,char **matches,int numMatches,
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           *channelToPos)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  __type _Var4;
  int iVar5;
  long lVar6;
  pointer ppVar7;
  ulong uVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar9;
  size_type sVar10;
  const_reference pvVar11;
  ChannelGroupManifest *pCVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  ostream *poVar15;
  void *pvVar16;
  uint64_t uVar17;
  int in_ECX;
  long in_RDX;
  ulong in_RDI;
  match m_2;
  const_iterator chanIdxHigh;
  const_iterator chanIdxLow;
  const_iterator chanHigh;
  const_iterator end;
  const_iterator chanLow;
  match m_1;
  const_iterator chan_1;
  string *s;
  iterator __end8;
  iterator __begin8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range8;
  size_t stringIndex;
  ConstIterator it;
  size_t i;
  match m;
  const_iterator chan;
  size_type pos;
  string componentName;
  string matchString;
  int c;
  ConstIterator *in_stack_fffffffffffffbc8;
  string *in_stack_fffffffffffffbd0;
  value_type *in_stack_fffffffffffffbd8;
  ostream *in_stack_fffffffffffffbe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf0;
  ostream *in_stack_fffffffffffffc00;
  ostream *in_stack_fffffffffffffc08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc10;
  bool local_369;
  _Self local_1c8;
  _Self local_1c0;
  _Self local_1b8;
  _Self local_1b0;
  _Self local_1a8;
  _Self local_1a0;
  _Self local_198;
  int local_190;
  undefined4 local_18c;
  undefined4 local_188;
  _Self local_180;
  _Self local_178;
  reference local_170;
  _Self local_168;
  _Self local_160;
  undefined8 local_158;
  ulong local_150;
  undefined8 local_148;
  undefined8 local_140;
  ulong local_138;
  undefined4 local_12c;
  int local_128;
  int local_124;
  undefined4 local_120;
  _Self local_118;
  _Self local_110;
  string local_108 [32];
  string local_e8 [32];
  long local_c8;
  string local_c0 [39];
  allocator<char> local_99;
  string local_98 [32];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  int local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  int local_1c;
  long local_18;
  ulong local_8;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  std::__cxx11::
  list<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
  ::clear((list<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
           *)in_stack_fffffffffffffbd0);
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  std::__cxx11::list<match,_std::allocator<match>_>::list
            ((list<match,_std::allocator<match>_> *)0x1085e7);
  std::__cxx11::
  list<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
  ::push_back((list<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
               *)in_stack_fffffffffffffbe0,(value_type *)in_stack_fffffffffffffbd8);
  std::__cxx11::list<match,_std::allocator<match>_>::~list
            ((list<match,_std::allocator<match>_> *)0x10860b);
  local_58 = 0;
  do {
    if (local_1c <= local_58) {
      return;
    }
    iVar5 = strcmp(*(char **)(local_18 + (long)local_58 * 8),"--and");
    if (iVar5 == 0) {
      local_78 = 0;
      uStack_70 = 0;
      local_68 = 0;
      std::__cxx11::list<match,_std::allocator<match>_>::list
                ((list<match,_std::allocator<match>_> *)0x10868f);
      std::__cxx11::
      list<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
      ::push_back((list<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
                   *)in_stack_fffffffffffffbe0,(value_type *)in_stack_fffffffffffffbd8);
      std::__cxx11::list<match,_std::allocator<match>_>::~list
                ((list<match,_std::allocator<match>_> *)0x1086b3);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08,
                 (allocator<char> *)in_stack_fffffffffffffc00);
      std::allocator<char>::~allocator(&local_99);
      std::__cxx11::string::string(local_c0);
      local_c8 = std::__cxx11::string::find((char)local_98,0x3a);
      if (local_c8 != -1) {
        std::__cxx11::string::substr((ulong)local_e8,(ulong)local_98);
        std::__cxx11::string::operator=(local_c0,local_e8);
        std::__cxx11::string::~string(local_e8);
        std::__cxx11::string::substr((ulong)local_108,(ulong)local_98);
        std::__cxx11::string::operator=(local_98,local_108);
        std::__cxx11::string::~string(local_108);
      }
      lVar6 = std::__cxx11::string::find_first_not_of((char *)local_98,0x1143f6);
      if (lVar6 == -1) {
        local_110._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     *)in_stack_fffffffffffffbc8,(key_type *)0x1088c5);
        local_118._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)in_stack_fffffffffffffbc8);
        bVar3 = std::operator!=(&local_110,&local_118);
        if (bVar3) {
          ppVar7 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                   ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                                 *)0x10891c);
          local_128 = ppVar7->second;
          local_124 = std::__cxx11::stoi(in_stack_fffffffffffffbd0,
                                         (size_t *)in_stack_fffffffffffffbc8,0);
          local_120 = 0xffffffff;
          std::__cxx11::
          list<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
          ::back((list<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
                  *)in_stack_fffffffffffffbd0);
          std::__cxx11::list<match,_std::allocator<match>_>::push_back
                    ((list<match,_std::allocator<match>_> *)in_stack_fffffffffffffbe0,
                     in_stack_fffffffffffffbd8);
        }
        local_12c = 4;
      }
      else {
        for (local_138 = 0; uVar2 = local_138, uVar8 = Imf_3_4::IDManifest::size(), uVar2 < uVar8;
            local_138 = local_138 + 1) {
          Imf_3_4::IDManifest::operator[](local_8);
          local_140 = Imf_3_4::IDManifest::ChannelGroupManifest::begin();
          while( true ) {
            Imf_3_4::IDManifest::operator[](local_8);
            local_148 = Imf_3_4::IDManifest::ChannelGroupManifest::end();
            bVar3 = Imf_3_4::operator!=((ConstIterator *)in_stack_fffffffffffffbd0,
                                        in_stack_fffffffffffffbc8);
            if (!bVar3) break;
            local_150 = 0;
            while( true ) {
              uVar2 = local_150;
              pvVar9 = Imf_3_4::IDManifest::ChannelGroupManifest::ConstIterator::text_abi_cxx11_
                                 ((ConstIterator *)0x108abe);
              sVar10 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size(pvVar9);
              if (sVar10 <= uVar2) break;
              bVar3 = std::operator==(in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8);
              if (bVar3) {
LAB_00108b77:
                pvVar9 = Imf_3_4::IDManifest::ChannelGroupManifest::ConstIterator::text_abi_cxx11_
                                   ((ConstIterator *)0x108b84);
                pvVar11 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[](pvVar9,local_150);
                lVar6 = std::__cxx11::string::find((string *)pvVar11,(ulong)local_98);
                if (lVar6 != -1) {
                  pCVar12 = (ChannelGroupManifest *)Imf_3_4::IDManifest::operator[](local_8);
                  Imf_3_4::IDManifest::ChannelGroupManifest::getEncodingScheme_abi_cxx11_(pCVar12);
                  _Var4 = std::operator==(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
                  if (_Var4) {
                    Imf_3_4::IDManifest::operator[](local_8);
                    local_158 = Imf_3_4::IDManifest::ChannelGroupManifest::getChannels_abi_cxx11_();
                    local_160._M_node =
                         (_Base_ptr)
                         std::
                         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)in_stack_fffffffffffffbc8);
                    local_168._M_node =
                         (_Base_ptr)
                         std::
                         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)in_stack_fffffffffffffbc8);
                    while (bVar3 = std::operator!=(&local_160,&local_168), bVar3) {
                      local_170 = std::
                                  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               *)in_stack_fffffffffffffbd0);
                      local_178._M_node =
                           (_Base_ptr)
                           std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                   *)in_stack_fffffffffffffbc8,(key_type *)0x108ccc);
                      local_180._M_node =
                           (_Base_ptr)
                           std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                  *)in_stack_fffffffffffffbc8);
                      bVar3 = std::operator!=(&local_178,&local_180);
                      if (bVar3) {
                        ppVar7 = std::
                                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                                 ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                                               *)0x108d26);
                        local_190 = ppVar7->second;
                        uVar13 = Imf_3_4::IDManifest::ChannelGroupManifest::ConstIterator::id
                                           ((ConstIterator *)0x108d3d);
                        local_18c = (undefined4)uVar13;
                        local_188 = 0xffffffff;
                        std::__cxx11::
                        list<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
                        ::back((list<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
                                *)in_stack_fffffffffffffbd0);
                        std::__cxx11::list<match,_std::allocator<match>_>::push_back
                                  ((list<match,_std::allocator<match>_> *)in_stack_fffffffffffffbe0,
                                   in_stack_fffffffffffffbd8);
                        poVar15 = std::operator<<((ostream *)&std::cerr,"adding match ");
                        pvVar16 = (void *)std::ostream::operator<<(poVar15,std::hex);
                        uVar13 = Imf_3_4::IDManifest::ChannelGroupManifest::ConstIterator::id
                                           ((ConstIterator *)0x108dc8);
                        pvVar16 = (void *)std::ostream::operator<<(pvVar16,uVar13);
                        poVar15 = (ostream *)std::ostream::operator<<(pvVar16,std::dec);
                        poVar15 = std::operator<<(poVar15," for string ");
                        pvVar9 = Imf_3_4::IDManifest::ChannelGroupManifest::ConstIterator::
                                 text_abi_cxx11_((ConstIterator *)0x108e3a);
                        pvVar11 = std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::operator[](pvVar9,local_150);
                        poVar15 = std::operator<<(poVar15,(string *)pvVar11);
                        poVar15 = std::operator<<(poVar15," in channel ");
                        ppVar7 = std::
                                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                                 ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                                               *)0x108e9e);
                        poVar15 = (ostream *)std::ostream::operator<<(poVar15,ppVar7->second);
                        poVar15 = std::operator<<(poVar15,'(');
                        ppVar7 = std::
                                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                                 ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                                               *)0x108ee1);
                        poVar15 = std::operator<<(poVar15,(string *)ppVar7);
                        std::operator<<(poVar15,")\n");
                      }
                      std::
                      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)in_stack_fffffffffffffbd0);
                    }
                  }
                  else {
                    pCVar12 = (ChannelGroupManifest *)Imf_3_4::IDManifest::operator[](local_8);
                    Imf_3_4::IDManifest::ChannelGroupManifest::getEncodingScheme_abi_cxx11_(pCVar12)
                    ;
                    _Var4 = std::operator==(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
                    if (_Var4) {
                      Imf_3_4::IDManifest::operator[](local_8);
                      Imf_3_4::IDManifest::ChannelGroupManifest::getChannels_abi_cxx11_();
                      local_198._M_node =
                           (_Base_ptr)
                           std::
                           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)in_stack_fffffffffffffbc8);
                      Imf_3_4::IDManifest::operator[](local_8);
                      Imf_3_4::IDManifest::ChannelGroupManifest::getChannels_abi_cxx11_();
                      local_1a0._M_node =
                           (_Base_ptr)
                           std::
                           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)in_stack_fffffffffffffbc8);
                      while (bVar3 = std::operator!=(&local_198,&local_1a0), bVar3) {
                        local_1a8._M_node = local_198._M_node;
                        std::
                        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)in_stack_fffffffffffffbd0);
                        bVar3 = std::operator!=(&local_1a8,&local_1a0);
                        if (bVar3) {
                          std::
                          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)in_stack_fffffffffffffbd0);
                          local_1b0._M_node =
                               (_Base_ptr)
                               std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                       *)in_stack_fffffffffffffbc8,(key_type *)0x10909b);
                          std::
                          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)in_stack_fffffffffffffbd0);
                          local_1b8._M_node =
                               (_Base_ptr)
                               std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                       *)in_stack_fffffffffffffbc8,(key_type *)0x1090e2);
                          local_1c0._M_node =
                               (_Base_ptr)
                               std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                      *)in_stack_fffffffffffffbc8);
                          bVar3 = std::operator!=(&local_1b0,&local_1c0);
                          local_369 = false;
                          if (bVar3) {
                            local_1c8._M_node =
                                 (_Base_ptr)
                                 std::
                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                 ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                        *)in_stack_fffffffffffffbc8);
                            local_369 = std::operator!=(&local_1b8,&local_1c8);
                          }
                          if (local_369 != false) {
                            ppVar7 = std::
                                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                                     ::operator->((
                                                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                                                  *)0x109186);
                            iVar5 = ppVar7->second;
                            uVar13 = Imf_3_4::IDManifest::ChannelGroupManifest::ConstIterator::id
                                               ((ConstIterator *)0x10919d);
                            ppVar7 = std::
                                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                                     ::operator->((
                                                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                                                  *)0x1091c3);
                            iVar1 = ppVar7->second;
                            uVar14 = Imf_3_4::IDManifest::ChannelGroupManifest::ConstIterator::id
                                               ((ConstIterator *)0x1091da);
                            std::__cxx11::
                            list<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
                            ::back((list<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
                                    *)in_stack_fffffffffffffbd0);
                            std::__cxx11::list<match,_std::allocator<match>_>::push_back
                                      ((list<match,_std::allocator<match>_> *)
                                       in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
                            poVar15 = std::operator<<((ostream *)&std::cerr,"adding match ");
                            pvVar16 = (void *)std::ostream::operator<<(poVar15,std::hex);
                            uVar17 = Imf_3_4::IDManifest::ChannelGroupManifest::ConstIterator::id
                                               ((ConstIterator *)0x10925e);
                            pvVar16 = (void *)std::ostream::operator<<(pvVar16,uVar17);
                            poVar15 = (ostream *)std::ostream::operator<<(pvVar16,std::dec);
                            poVar15 = std::operator<<(poVar15," for string ");
                            pvVar9 = Imf_3_4::IDManifest::ChannelGroupManifest::ConstIterator::
                                     text_abi_cxx11_((ConstIterator *)0x1092d0);
                            pvVar11 = std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::operator[](pvVar9,local_150);
                            poVar15 = std::operator<<(poVar15,(string *)pvVar11);
                            poVar15 = std::operator<<(poVar15,": ");
                            pvVar16 = (void *)std::ostream::operator<<(poVar15,std::hex);
                            poVar15 = (ostream *)std::ostream::operator<<(pvVar16,(uint)uVar13);
                            poVar15 = std::operator<<(poVar15," in channel ");
                            poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar5);
                            in_stack_fffffffffffffc10 =
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)std::operator<<(poVar15,'(');
                            ppVar7 = std::
                                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                                     ::operator->((
                                                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                                                  *)0x1093a1);
                            in_stack_fffffffffffffc08 =
                                 std::operator<<((ostream *)in_stack_fffffffffffffc10,
                                                 (string *)ppVar7);
                            in_stack_fffffffffffffc00 =
                                 std::operator<<(in_stack_fffffffffffffc08,"), ");
                            pvVar16 = (void *)std::ostream::operator<<
                                                        (in_stack_fffffffffffffc00,std::hex);
                            in_stack_fffffffffffffbf0 =
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)std::ostream::operator<<(pvVar16,(uint)(uVar14 >> 0x20));
                            in_stack_fffffffffffffbe8 =
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)std::operator<<((ostream *)in_stack_fffffffffffffbf0,
                                                    " in channel ");
                            in_stack_fffffffffffffbe0 =
                                 (ostream *)
                                 std::ostream::operator<<(in_stack_fffffffffffffbe8,iVar1);
                            in_stack_fffffffffffffbd8 =
                                 (value_type *)std::operator<<(in_stack_fffffffffffffbe0,'(');
                            ppVar7 = std::
                                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                                     ::operator->((
                                                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                                                  *)0x109450);
                            in_stack_fffffffffffffbd0 =
                                 (string *)
                                 std::operator<<((ostream *)in_stack_fffffffffffffbd8,
                                                 (string *)ppVar7);
                            std::operator<<((ostream *)in_stack_fffffffffffffbd0,")\n");
                          }
                          std::
                          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)in_stack_fffffffffffffbd0);
                          bVar3 = std::operator!=(&local_198,&local_1a0);
                          if (bVar3) {
                            std::
                            _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)in_stack_fffffffffffffbd0);
                          }
                        }
                      }
                    }
                  }
                }
              }
              else {
                Imf_3_4::IDManifest::operator[](local_8);
                pvVar9 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)Imf_3_4::IDManifest::ChannelGroupManifest::getComponents_abi_cxx11_();
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](pvVar9,local_150);
                _Var4 = std::operator==(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
                if (_Var4) goto LAB_00108b77;
              }
              local_150 = local_150 + 1;
            }
            Imf_3_4::IDManifest::ChannelGroupManifest::ConstIterator::operator++
                      ((ConstIterator *)in_stack_fffffffffffffbd0);
          }
        }
        local_12c = 0;
      }
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string(local_98);
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

void
setIds (
    const IDManifest&       mfst,
    list<list<match>>&      ids,
    const char*             matches[],
    int                     numMatches,
    const map<string, int>& channelToPos)
{

    //
    // initially one single list
    //
    ids.clear ();
    ids.push_back (list<match> ());

    //
    // check each manifest, each entry, against each matching expression
    //
    for (int c = 0; c < numMatches; ++c)
    {

        //
        // an 'and' argument means proceed to the next group of ids
        // must find a match in every such group
        //
        if (strcmp (matches[c], "--and") == 0)
        {
            ids.push_back (list<match> ());
            continue;
        }

        string matchString (matches[c]);

        //
        // handle strings of the form component:searchstring
        // and channel:idnumber
        //
        string            componentName;
        string::size_type pos = matchString.find (':');
        if (pos != string::npos)
        {
            componentName = matchString.substr (0, pos);
            matchString   = matchString.substr (pos + 1);
        }

        if (matchString.find_first_not_of ("0123456789") == string::npos)
        {
            map<string, int>::const_iterator chan =
                channelToPos.find (componentName);
            if (chan != channelToPos.end ())
            {
                match m;
                m.channel1 = chan->second;
                m.id1      = stoi (matchString);
                m.channel2 = -1;
                ids.back ().push_back (m);
            }
            continue; // skip parsing the manifests for this string
        }

        // check the manifest for each group of channels
        for (size_t i = 0; i < mfst.size (); ++i)
        {

            for (IDManifest::ChannelGroupManifest::ConstIterator it =
                     mfst[i].begin ();
                 it != mfst[i].end ();
                 ++it)
            {
                for (size_t stringIndex = 0; stringIndex < it.text ().size ();
                     ++stringIndex)
                {
                    if (componentName == "" ||
                        mfst[i].getComponents ()[stringIndex] == componentName)
                    {
                        // simple substring matching only: could do wildcards or regexes here instead
                        if (it.text ()[stringIndex].find (matchString) !=
                            string::npos)
                        {
                            // a match is found - add it to the corresponding channels
                            if (mfst[i].getEncodingScheme () ==
                                IDManifest::ID_SCHEME)
                            {
                                // simple scheme: the ID channel has to match
                                for (const string& s: mfst[i].getChannels ())
                                {
                                    map<string, int>::const_iterator chan =
                                        channelToPos.find (s);
                                    if (chan != channelToPos.end ())
                                    {
                                        //could support matching the ID against a specific channel
                                        //that check would happen here

                                        match m;
                                        m.channel1 = chan->second;
                                        m.id1      = uint32_t (it.id ());
                                        m.channel2 = -1;
                                        ids.back ().push_back (m);
                                        cerr << "adding match " << hex
                                             << it.id () << dec
                                             << " for string "
                                             << it.text ()[stringIndex]
                                             << " in channel " << chan->second
                                             << '(' << chan->first << ")\n";
                                    }
                                }
                            }
                            else if (
                                mfst[i].getEncodingScheme () ==
                                IDManifest::ID2_SCHEME)
                            {
                                // 64 bit IDs are spread across two channels, with the least significant bits
                                // in the first channel (alphabetically) and the most significant bits in the second
                                // so process the channel set in pairs

                                set<string>::const_iterator chanLow =
                                    mfst[i].getChannels ().begin ();
                                set<string>::const_iterator end =
                                    mfst[i].getChannels ().end ();

                                while (chanLow != end)
                                {
                                    set<string>::const_iterator chanHigh =
                                        chanLow;
                                    ++chanHigh;

                                    if (chanHigh != end)
                                    {
                                        map<string, int>::const_iterator
                                            chanIdxLow =
                                                channelToPos.find (*chanLow);
                                        map<string, int>::const_iterator
                                            chanIdxHigh =
                                                channelToPos.find (*chanHigh);

                                        if (chanIdxLow != channelToPos.end () &&
                                            chanIdxHigh != channelToPos.end ())
                                        {
                                            // to match against specific channels, check at least one channel matches here
                                            match m;
                                            m.channel1 = chanIdxLow->second;
                                            m.id1      = it.id () & 0xFFFFFFFF;
                                            m.channel2 = chanIdxHigh->second;
                                            m.id2      = it.id () >> 32;
                                            ids.back ().push_back (m);

                                            cerr << "adding match " << hex
                                                 << it.id () << dec
                                                 << " for string "
                                                 << it.text ()[stringIndex]
                                                 << ": " << hex << m.id1
                                                 << " in channel " << m.channel1
                                                 << '(' << chanIdxLow->first
                                                 << "), " << hex << m.id2
                                                 << " in channel " << m.channel2
                                                 << '(' << chanIdxHigh->first
                                                 << ")\n";
                                        }

                                        ++chanLow;
                                        if (chanLow != end) { ++chanLow; }
                                    }
                                }
                            }
                        }
                    }
                }
            }
        }
    }
}